

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O1

void __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::set_up_containers
          (Bitmap_cubical_complex_base<double> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sizes,bool is_pos_inf)

{
  iterator iVar1;
  pointer puVar2;
  undefined7 in_register_00000011;
  long lVar3;
  uint multiplier;
  allocator_type local_59;
  uint local_58;
  undefined4 local_54;
  value_type_conflict2 local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_54 = (undefined4)CONCAT71(in_register_00000011,is_pos_inf);
  local_58 = 1;
  puVar2 = (sizes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((sizes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    lVar3 = 0;
    do {
      iVar1._M_current =
           (this->sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->sizes,iVar1,
                   puVar2 + lVar3);
      }
      else {
        *iVar1._M_current = puVar2[lVar3];
        (this->sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           (this->multipliers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->multipliers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->multipliers,iVar1,
                   &local_58);
      }
      else {
        *iVar1._M_current = local_58;
        (this->multipliers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_58 = ((sizes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar3] * 2 + 1) * local_58;
      lVar3 = lVar3 + 1;
      puVar2 = (sizes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar3 != (long)(sizes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2);
  }
  if ((char)local_54 == '\0') {
    local_50 = -INFINITY;
  }
  else {
    local_50 = INFINITY;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,(ulong)local_58,&local_50,&local_59);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->data,&local_48);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void set_up_containers(const std::vector<unsigned>& sizes, bool is_pos_inf) {
    // The fact that multipliers[0]=1 is relied on by optimizations in other functions
    unsigned multiplier = 1;
    for (std::size_t i = 0; i != sizes.size(); ++i) {
      this->sizes.push_back(sizes[i]);
      this->multipliers.push_back(multiplier);
      multiplier *= 2 * sizes[i] + 1;
    }
    if(is_pos_inf)
      this->data = std::vector<T>(multiplier, std::numeric_limits<T>::infinity());
    else
      this->data = std::vector<T>(multiplier, -std::numeric_limits<T>::infinity());
  }